

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Stress::anon_unknown_0::BlendingCase::drawTestImage
          (BlendingCase *this,PixelBufferAccess *dst,GLuint uColorLoc,int maxVertexIndex)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uint uVar4;
  float fVar5;
  deUint16 indices [3];
  Vec4 color;
  Random rnd;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  BlendingCase *local_50;
  PixelBufferAccess *local_48;
  deRandom local_40;
  long lVar3;
  
  local_50 = this;
  local_48 = dst;
  iVar1 = (*((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  deRandom_init(&local_40,0x7b);
  (**(code **)(lVar3 + 0x188))(0x4000);
  (**(code **)(lVar3 + 0x100))(0x8006);
  (**(code **)(lVar3 + 0x120))(1,1);
  uVar4 = maxVertexIndex + 1;
  iVar1 = 0x14;
  do {
    local_68 = 0;
    uStack_60 = 0;
    fVar5 = deRandom_getFloat(&local_40);
    local_68 = CONCAT44(local_68._4_4_,fVar5);
    fVar5 = deRandom_getFloat(&local_40);
    local_68 = CONCAT44(fVar5,(undefined4)local_68);
    fVar5 = deRandom_getFloat(&local_40);
    uStack_60 = CONCAT44(uStack_60._4_4_,fVar5);
    fVar5 = deRandom_getFloat(&local_40);
    uStack_60 = CONCAT44(fVar5,(undefined4)uStack_60);
    (**(code **)(lVar3 + 0x15a8))(uColorLoc,1,&local_68);
    dVar2 = deRandom_getUint32(&local_40);
    local_6e = (undefined2)(dVar2 % uVar4);
    dVar2 = deRandom_getUint32(&local_40);
    local_6c = (undefined2)(dVar2 % uVar4);
    dVar2 = deRandom_getUint32(&local_40);
    local_6a = (undefined2)(dVar2 % uVar4);
    (**(code **)(lVar3 + 0x568))(4,3,0x1403,&local_6e);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  (**(code **)(lVar3 + 0x648))();
  glu::readPixels(((local_50->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context
                  )->m_renderCtx,0,0,local_48);
  return;
}

Assistant:

void BlendingCase::drawTestImage (tcu::PixelBufferAccess dst, GLuint uColorLoc, int maxVertexIndex)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();
	de::Random				rnd	(123);

	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.blendEquation(GL_FUNC_ADD);
	gl.blendFunc(GL_ONE, GL_ONE);

	for (int tri = 0; tri < 20; ++tri)
	{
		tcu::Vec4 color;
		color.x() = rnd.getFloat();
		color.y() = rnd.getFloat();
		color.z() = rnd.getFloat();
		color.w() = rnd.getFloat();
		gl.uniform4fv(uColorLoc, 1, color.getPtr());

		deUint16 indices[3];
		indices[0] = (deUint16)rnd.getInt(0, maxVertexIndex);
		indices[1] = (deUint16)rnd.getInt(0, maxVertexIndex);
		indices[2] = (deUint16)rnd.getInt(0, maxVertexIndex);

		gl.drawElements(GL_TRIANGLES, 3, GL_UNSIGNED_SHORT, indices);
	}

	gl.finish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst);
}